

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

void raviV_op_bnot(lua_State *L,TValue *ra,TValue *rb)

{
  int iVar1;
  TValue *io;
  lua_Integer ib;
  TValue *rb_local;
  TValue *ra_local;
  lua_State *L_local;
  
  ib = (lua_Integer)rb;
  rb_local = ra;
  ra_local = (TValue *)L;
  if (rb->tt_ == 0x13) {
    if (rb->tt_ != 0x13) {
      __assert_fail("((((rb))->tt_) == (((3) | ((1) << 4))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0xc4f,"void raviV_op_bnot(lua_State *, TValue *, TValue *)");
    }
    io = (TValue *)(rb->value_).gc;
  }
  else {
    iVar1 = luaV_tointegerns(rb,(lua_Integer *)&io,F2Ieq);
    if (iVar1 == 0) {
      luaT_trybinTM((lua_State *)ra_local,(TValue *)ib,(TValue *)ib,rb_local,TM_BNOT);
      return;
    }
  }
  (rb_local->value_).i = (ulong)io ^ 0xffffffffffffffff;
  rb_local->tt_ = 0x13;
  return;
}

Assistant:

void raviV_op_bnot(lua_State *L, TValue *ra, TValue *rb) {
  lua_Integer ib;
  if (tointegerns(rb, &ib)) { setivalue(ra, intop (^, ~l_castS2U(0), ib)); }
  else {
    luaT_trybinTM(L, rb, rb, ra, TM_BNOT);
  }
}